

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::DynamicSinglePixelOffsets::operator()
          (DynamicSinglePixelOffsets *this,IVec2 *pixCoord,IVec2 (*dst) [4])

{
  int iVar1;
  int iVar2;
  int i_2;
  long lVar3;
  Vector<int,_2> res;
  Vector<int,_2> res_1;
  int local_58 [2];
  IVec2 local_50;
  int aiStack_48 [2];
  ulong local_40;
  SinglePixelOffsets local_38;
  
  iVar1 = (this->m_offsetRange).m_data[0];
  iVar2 = (this->m_offsetRange).m_data[1];
  local_40 = *(ulong *)pixCoord->m_data << 0x20 | *(ulong *)pixCoord->m_data >> 0x20;
  lVar3 = 0;
  do {
    aiStack_48[lVar3] = (iVar2 - iVar1) + 1;
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  local_58[0] = 0;
  local_58[1] = 0;
  lVar3 = 0;
  do {
    local_58[lVar3] =
         *(int *)((long)(local_38.super_MultiplePixelOffsets.m_offsets + -2) + lVar3 * 4) %
         aiStack_48[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  local_50.m_data[0] = 0;
  local_50.m_data[1] = 0;
  lVar3 = 0;
  do {
    aiStack_48[lVar3 + -2] = local_58[lVar3] + iVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  SinglePixelOffsets::SinglePixelOffsets(&local_38,&local_50);
  *&(*dst)[2].m_data = local_38.super_MultiplePixelOffsets.m_offsets[2].m_data;
  *&(*dst)[3].m_data = local_38.super_MultiplePixelOffsets.m_offsets[3].m_data;
  *&(*dst)[0].m_data = local_38.super_MultiplePixelOffsets.m_offsets[0].m_data;
  *&(*dst)[1].m_data = local_38.super_MultiplePixelOffsets.m_offsets[1].m_data;
  return;
}

Assistant:

void operator() (const IVec2& pixCoord, IVec2 (&dst)[4]) const
	{
		const int offsetRangeSize = m_offsetRange.y() - m_offsetRange.x() + 1;
		SinglePixelOffsets(tcu::mod(pixCoord.swizzle(1,0), IVec2(offsetRangeSize)) + m_offsetRange.x())(IVec2(), dst);
	}